

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O2

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  CSzCoderInfo *pCVar1;
  long lVar2;
  long lVar3;
  Byte BVar4;
  byte bVar5;
  UInt32 m;
  size_t sVar6;
  Byte *pBVar7;
  UInt64 UVar8;
  ILookInStream *pIVar9;
  undefined8 uVar10;
  SRes SVar11;
  Bool_conflict BVar12;
  UInt32 UVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  UInt64 UVar17;
  CPpmd7_Context *pCVar18;
  uint uVar19;
  UInt64 inSize;
  _func_UInt32_void_ptr_UInt32 *p_Var20;
  _func_UInt32_void_ptr_UInt32 *p_Var21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint local_4ce0;
  Byte *local_4cc8;
  uint local_4cc0;
  ELzmaStatus local_4cbc;
  CPpmd7_Context *local_4cb8;
  Byte *local_4cb0;
  SizeT inProcessed;
  UInt64 local_4ca0;
  _func_UInt32_void_ptr_UInt32 *local_4c98;
  CSzAr *local_4c90;
  undefined1 local_4c88 [16];
  Byte *local_4c78;
  CPpmd7_Context *local_4c68;
  UInt64 *local_4c60;
  ILookInStream *local_4c58;
  void *inBuf;
  undefined1 local_4c48 [16];
  undefined1 local_4c38 [16];
  undefined8 local_4c28;
  ILookInStream *local_4c20;
  CPpmd7z_RangeDec local_4c18;
  _func_UInt32_void_ptr_UInt32 *local_4bf0;
  Byte *local_4be8;
  UInt64 *local_4be0;
  ulong local_4bd8;
  CSzFolder folder;
  undefined1 local_4b58 [16];
  undefined8 local_4b48;
  CSzData sd;
  CPpmd7 ppmd;
  
  uVar23 = (ulong)folderIndex;
  sVar6 = p->FoCodersOffsets[uVar23];
  pBVar7 = p->CodersData;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - sVar6;
  sd.Data = pBVar7 + sVar6;
  SVar11 = SzGetNextFolderItem(&folder,&sd);
  if (SVar11 != 0) {
    return SVar11;
  }
  if (sd.Size != 0) {
    return 0xb;
  }
  if (folder.UnpackStream != p->FoToMainUnpackSizeIndex[uVar23]) {
    return 0xb;
  }
  local_4cb0 = pBVar7 + sVar6;
  local_4c90 = p;
  local_4c58 = inStream;
  UVar17 = SzAr_GetFolderUnpackSize(p,folderIndex);
  UVar13 = folder.NumCoders;
  if (UVar17 != outSize) {
    return 0xb;
  }
  local_4c78 = (Byte *)0x0;
  local_4c88 = (undefined1  [16])0x0;
  local_4c60 = p->PackPositions + p->FoStartPackStreamIndex[uVar23];
  local_4b58 = (undefined1  [16])0x0;
  local_4b48 = 0;
  local_4ce0 = 4;
  local_4bd8 = uVar23;
  if ((folder.NumCoders - 5 < 0xfffffffc) ||
     (local_4be0 = p->CoderUnpackSizes + p->FoToCoderUnpackSizes[uVar23],
     BVar12 = IS_SUPPORTED_CODER(folder.Coders), BVar12 == 0)) goto LAB_0059c14a;
  if (UVar13 == 4) {
    BVar12 = IS_SUPPORTED_CODER(folder.Coders + 1);
    if ((BVar12 == 0) || (BVar12 = IS_SUPPORTED_CODER(folder.Coders + 2), BVar12 == 0))
    goto LAB_0059c14a;
    auVar26._0_4_ = -(uint)(folder.NumBonds == 3);
    auVar26._4_4_ = -(uint)(folder.Bonds[0].InIndex == 5);
    auVar26._8_4_ = -(uint)(folder.Bonds[0].OutIndex == 0);
    auVar26._12_4_ = -(uint)(folder.Bonds[1].InIndex == 4);
    auVar25._0_4_ = -(uint)(folder.PackStreams[0] == 2);
    auVar25._4_4_ = -(uint)(folder.PackStreams[1] == 6);
    auVar25._8_4_ = -(uint)(folder.PackStreams[2] == 1);
    auVar25._12_4_ = -(uint)(folder.PackStreams[3] == 0);
    auVar25 = packssdw(auVar25,auVar26);
    auVar25 = packsswb(auVar25,auVar25);
    local_4ca0 = startPos;
    if ((((byte)(SUB161(auVar25 >> 7,0) & 1 | (SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar25 >> 0x17,0) & 1) << 2 | (SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar25 >> 0x27,0) & 1) << 4 | (SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar25 >> 0x37,0) & 1) << 6 | SUB161(auVar25 >> 0x3f,0) << 7) != 0xff) ||
        (((folder.Coders[3].MethodID != 0x303011b || (folder.NumPackStreams != 4)) ||
         (folder.Bonds[1].OutIndex != 1)))) ||
       (((folder.Bonds[2].InIndex != 3 || (folder.Bonds[2].OutIndex != 2)) ||
        (folder.Coders[3].NumStreams != '\x04')))) goto LAB_0059c14a;
  }
  else if (UVar13 == 2) {
    if ((((folder.Coders[1].NumStreams != '\x01') ||
         (local_4ca0 = startPos, folder.NumPackStreams != 1)) ||
        ((folder.PackStreams[0] != 0 ||
         (((folder.NumBonds != 1 || (folder.Bonds[0].InIndex != 1)) ||
          (folder.Bonds[0].OutIndex != 0)))))) ||
       (((folder.Coders[1].MethodID != 3 && (folder.Coders[1].MethodID != 0x3030103)) &&
        ((folder.Coders[1].MethodID != 0x3030205 &&
         (((folder.Coders[1].MethodID != 0x3030401 && (folder.Coders[1].MethodID != 0x3030501)) &&
          ((folder.Coders[1].MethodID != 0x3030701 && (folder.Coders[1].MethodID != 0x3030805)))))))
        ))) goto LAB_0059c14a;
  }
  else if ((((UVar13 != 1) || (folder.NumPackStreams != 1)) || (folder.PackStreams[0] != 0)) ||
          (local_4ca0 = startPos, folder.NumBonds != 0)) goto LAB_0059c14a;
  local_4be8 = outBuffer + outSize;
  uVar14 = 1;
  local_4cc8 = (Byte *)0x0;
  local_4c68 = (CPpmd7_Context *)0x0;
  local_4c98 = (_func_UInt32_void_ptr_UInt32 *)0x0;
  local_4ca0 = startPos;
  for (uVar23 = 0; uVar23 < UVar13; uVar23 = uVar23 + 1) {
    pCVar1 = folder.Coders + uVar23;
    m = folder.Coders[uVar23].MethodID;
    BVar12 = IS_MAIN_METHOD(m);
    if (BVar12 == 0) {
      if (m == 0x303011b) {
        if (uVar23 == 3) {
          UVar17 = local_4c60[1];
          UVar8 = local_4c60[2];
          inSize = UVar8 - UVar17;
          local_4cc8 = (Byte *)(*allocMain->Alloc)(allocMain,inSize);
          pIVar9 = local_4c58;
          if (local_4cc8 == (Byte *)0x0 && UVar8 != UVar17) {
            local_4cc8 = (Byte *)0x0;
            goto LAB_0059ccb7;
          }
          local_4ce0 = LookInStream_SeekTo(local_4c58,UVar17 + local_4ca0);
          if (local_4ce0 == 0) {
            local_4ce0 = SzDecodeCopy(inSize,pIVar9,local_4cc8);
            p_Var20 = local_4c98;
            local_4c98 = p_Var20;
            if (local_4ce0 == 0) {
              if ((((local_4b58 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
                  ((local_4b58 & (undefined1  [16])0x3) == (undefined1  [16])0x0)) &&
                 (local_4c98 + local_4b58._8_8_ + local_4b58._0_8_ ==
                  (_func_UInt32_void_ptr_UInt32 *)outSize)) {
                ppmd.MinContext = local_4c68;
                ppmd._32_8_ = local_4c98 + (long)&local_4c68->NumStats;
                ppmd.MaxContext = (CPpmd7_Context *)local_4c88._0_8_;
                ppmd._40_8_ = (long)(UInt16 *)local_4c88._0_8_ + local_4b58._0_8_;
                ppmd._48_8_ = (Byte *)local_4c88._8_8_ + local_4b58._8_8_;
                ppmd._24_8_ = local_4cc8;
                ppmd.FoundState = (CPpmd_State *)local_4c88._8_8_;
                ppmd._56_8_ = local_4cc8 + inSize;
                ppmd.LoUnit = local_4be8;
                ppmd.Base = outBuffer;
                Bcj2Dec_Init((CBcj2Dec *)&ppmd);
                local_4cc0 = Bcj2Dec_Decode((CBcj2Dec *)&ppmd);
                if (local_4cc0 == 0) {
                  lVar22 = 0;
                  while (lVar22 != 4) {
                    lVar2 = lVar22 * 8;
                    lVar3 = lVar22 * 8;
                    lVar22 = lVar22 + 1;
                    local_4cc0 = uVar14;
                    if (*(long *)(ppmd.Indx2Units + lVar2 + -0x6c) !=
                        *(long *)(ppmd.Indx2Units + lVar3 + -0x4c)) goto LAB_0059ccfe;
                  }
                  local_4cc0 = uVar14;
                  local_4c98 = p_Var20;
                  if ((int)ppmd.UnitsStart == 0) {
                    if ((ppmd.Base == ppmd.LoUnit) && ((int)ppmd.HiUnit == 0)) goto LAB_0059cc16;
                    goto LAB_0059cca5;
                  }
                }
                goto LAB_0059ccfe;
              }
LAB_0059cca5:
              local_4ce0 = 1;
              local_4c98 = p_Var20;
            }
          }
          goto LAB_0059cccc;
        }
      }
      else if (uVar23 == 1) {
        BVar4 = folder.Coders[1].PropsSize;
        if (m == 3) {
          if (BVar4 != '\x01') goto LAB_0059cca1;
          Delta_Init((Byte *)&ppmd);
          Delta_Decode((Byte *)&ppmd,local_4cb0[pCVar1->PropsOffset] + 1,outBuffer,outSize);
        }
        else {
          if (BVar4 != '\0') goto LAB_0059cca1;
          if (m == 0x3030805) {
            SPARC_Convert(outBuffer,outSize,0,0);
          }
          else if (m == 0x3030205) {
            PPC_Convert(outBuffer,outSize,0,0);
          }
          else if (m == 0x3030401) {
            IA64_Convert(outBuffer,outSize,0,0);
          }
          else if (m == 0x3030501) {
            ARM_Convert(outBuffer,outSize,0,0);
          }
          else if (m == 0x3030701) {
            ARMT_Convert(outBuffer,outSize,0,0);
          }
          else {
            if (m != 0x3030103) goto LAB_0059cca1;
            ppmd.MinContext = (CPpmd7_Context *)((ulong)ppmd.MinContext & 0xffffffff00000000);
            x86_Convert(outBuffer,outSize,0,(UInt32 *)&ppmd,0);
          }
        }
        goto LAB_0059cc16;
      }
LAB_0059cca1:
      local_4ce0 = 4;
      goto LAB_0059cccc;
    }
    uVar19 = 0;
    p_Var20 = (_func_UInt32_void_ptr_UInt32 *)outSize;
    pCVar18 = (CPpmd7_Context *)outBuffer;
    if (UVar13 == 4) {
      p_Var20 = (_func_UInt32_void_ptr_UInt32 *)local_4be0[uVar23];
      uVar19 = (&DAT_0060a6d0)[uVar23];
      if (uVar23 < 2) {
        pCVar18 = (CPpmd7_Context *)(*allocMain->Alloc)(allocMain,(size_t)p_Var20);
        if (p_Var20 != (_func_UInt32_void_ptr_UInt32 *)0x0 && pCVar18 == (CPpmd7_Context *)0x0) {
LAB_0059ccb7:
          local_4ce0 = 2;
          goto LAB_0059cccc;
        }
        uVar15 = (1 - (int)uVar23) * 8;
        *(CPpmd7_Context **)(local_4c88 + uVar15) = pCVar18;
        *(_func_UInt32_void_ptr_UInt32 **)(local_4b58 + uVar15) = p_Var20;
      }
      else {
        if (uVar23 != 2) goto LAB_0059cca1;
        if (outSize < p_Var20) {
          local_4ce0 = 5;
          goto LAB_0059cccc;
        }
        local_4c68 = (CPpmd7_Context *)(outBuffer + (outSize - (long)p_Var20));
        pCVar18 = local_4c68;
        local_4c98 = p_Var20;
      }
    }
    local_4cb8 = pCVar18;
    pIVar9 = local_4c58;
    UVar17 = local_4c60[uVar19];
    UVar8 = local_4c60[uVar19 + 1];
    local_4ce0 = LookInStream_SeekTo(local_4c58,UVar17 + local_4ca0);
    if (local_4ce0 != 0) goto LAB_0059cccc;
    p_Var21 = (_func_UInt32_void_ptr_UInt32 *)(UVar8 - UVar17);
    UVar13 = folder.Coders[uVar23].MethodID;
    if (UVar13 == 0x30401) {
      inBuf = ReadByte;
      local_4c20 = pIVar9;
      local_4c28 = 0;
      local_4c38 = (undefined1  [16])0x0;
      local_4c48 = (undefined1  [16])0x0;
      if (((folder.Coders[uVar23].PropsSize == '\x05') &&
          (bVar5 = local_4cb0[pCVar1->PropsOffset], 0xc0 < (byte)(bVar5 + 0xbf))) &&
         (UVar13 = *(UInt32 *)(local_4cb0 + pCVar1->PropsOffset + 1), local_4bf0 = p_Var21,
         0x823 < UVar13 + 0x24)) {
        Ppmd7_Construct(&ppmd);
        BVar12 = Ppmd7_Alloc(&ppmd,UVar13,allocMain);
        if (BVar12 != 0) {
          Ppmd7_Init(&ppmd,(uint)bVar5);
          Ppmd7z_RangeDec_CreateVTable(&local_4c18);
          local_4c18.Stream = (IByteIn *)&inBuf;
          BVar12 = Ppmd7z_RangeDec_Init(&local_4c18);
          pCVar18 = local_4cb8;
          local_4ce0 = 1;
          if (BVar12 != 0) {
            if ((int)local_4c28 == 0) {
              for (p_Var21 = (_func_UInt32_void_ptr_UInt32 *)0x0; p_Var20 != p_Var21;
                  p_Var21 = p_Var21 + 1) {
                iVar16 = Ppmd7_DecodeSymbol(&ppmd,&local_4c18.p);
                if (((int)local_4c28 != 0) || (iVar16 < 0)) {
                  local_4ce0 = local_4c28._4_4_ + (uint)(local_4c28._4_4_ == 0);
                  goto LAB_0059cbfb;
                }
                p_Var21[(long)&pCVar18->NumStats] = (_func_UInt32_void_ptr_UInt32)(char)iVar16;
              }
              local_4ce0 = (uint)(local_4c18.Code != 0 ||
                                 (_func_UInt32_void_ptr_UInt32 *)
                                 ((local_4c38._8_8_ + local_4c48._0_8_) - local_4c38._0_8_) !=
                                 local_4bf0);
            }
            else {
              local_4ce0 = local_4c28._4_4_ + (uint)(local_4c28._4_4_ == 0);
            }
          }
LAB_0059cbfb:
          Ppmd7_Free(&ppmd,allocMain);
          if (local_4ce0 == 0) goto LAB_0059cc16;
          goto LAB_0059cccc;
        }
        local_4ce0 = 2;
      }
      else {
        local_4ce0 = 4;
      }
      local_4c78 = local_4cc8;
      goto LAB_0059c14a;
    }
    if (UVar13 == 0x21) {
      ppmd.FoundState = (CPpmd_State *)0x0;
      ppmd.OrderFall = 0;
      ppmd.InitEsc = 0;
      local_4cc0 = uVar14;
      if (folder.Coders[uVar23].PropsSize == '\x01') {
        local_4cc0 = Lzma2Dec_AllocateProbs
                               ((CLzma2Dec *)&ppmd,local_4cb0[pCVar1->PropsOffset],allocMain);
        if (local_4cc0 == 0) {
          ppmd._24_8_ = local_4cb8;
          ppmd._56_8_ = p_Var20;
          Lzma2Dec_Init((CLzma2Dec *)&ppmd);
          do {
            inBuf = (void *)0x0;
            local_4c18.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
            if (p_Var21 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
              local_4c18.p.GetThreshold = p_Var21;
            }
            local_4ce0 = (*pIVar9->Look)(pIVar9,&inBuf,(size_t *)&local_4c18);
            uVar10 = ppmd._48_8_;
            if (local_4ce0 != 0) break;
            inProcessed = (SizeT)local_4c18.p.GetThreshold;
            local_4ce0 = Lzma2Dec_DecodeToDic
                                   ((CLzma2Dec *)&ppmd,(SizeT)p_Var20,(Byte *)inBuf,&inProcessed,
                                    LZMA_FINISH_END,&local_4cbc);
            local_4c18.p.GetThreshold = local_4c18.p.GetThreshold + -inProcessed;
            if (local_4ce0 != 0) break;
            p_Var21 = p_Var21 + -inProcessed;
            if (local_4cbc == LZMA_STATUS_FINISHED_WITH_MARK) {
              bVar24 = p_Var20 == (_func_UInt32_void_ptr_UInt32 *)ppmd._48_8_ &&
                       p_Var21 == (_func_UInt32_void_ptr_UInt32 *)0x0;
              goto LAB_0059cb86;
            }
            if ((inProcessed == 0) && (uVar10 == ppmd._48_8_)) goto LAB_0059cb2b;
            local_4ce0 = (*pIVar9->Skip)(pIVar9,inProcessed);
          } while (local_4ce0 == 0);
LAB_0059cb8d:
          LzmaDec_FreeProbs((CLzmaDec *)&ppmd,allocMain);
          goto joined_r0x0059c6ff;
        }
      }
LAB_0059ccfe:
      local_4c78 = local_4cc8;
      local_4ce0 = local_4cc0;
      goto LAB_0059c14a;
    }
    if (UVar13 == 0x30101) {
      ppmd.FoundState = (CPpmd_State *)0x0;
      ppmd.OrderFall = 0;
      ppmd.InitEsc = 0;
      local_4ce0 = LzmaDec_AllocateProbs
                             ((CLzmaDec *)&ppmd,local_4cb0 + pCVar1->PropsOffset,
                              (uint)folder.Coders[uVar23].PropsSize,allocMain);
      if (local_4ce0 == 0) {
        ppmd._24_8_ = local_4cb8;
        ppmd._56_8_ = p_Var20;
        LzmaDec_Init((CLzmaDec *)&ppmd);
LAB_0059c99e:
        inBuf = (void *)0x0;
        local_4c18.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
        if (p_Var21 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
          local_4c18.p.GetThreshold = p_Var21;
        }
        local_4ce0 = (*pIVar9->Look)(pIVar9,&inBuf,(size_t *)&local_4c18);
        uVar10 = ppmd._48_8_;
        if (local_4ce0 == 0) {
          inProcessed = (SizeT)local_4c18.p.GetThreshold;
          local_4ce0 = LzmaDec_DecodeToDic((CLzmaDec *)&ppmd,(SizeT)p_Var20,(Byte *)inBuf,
                                           &inProcessed,LZMA_FINISH_END,&local_4cbc);
          local_4c18.p.GetThreshold = local_4c18.p.GetThreshold + -inProcessed;
          if (local_4ce0 == 0) {
            p_Var21 = p_Var21 + -inProcessed;
            if (local_4cbc == LZMA_STATUS_FINISHED_WITH_MARK) {
              bVar24 = (_func_UInt32_void_ptr_UInt32 *)ppmd._48_8_ == p_Var20 &&
                       p_Var21 == (_func_UInt32_void_ptr_UInt32 *)0x0;
LAB_0059cb86:
              local_4ce0 = (uint)!bVar24;
            }
            else if (((local_4cbc == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) &&
                     ((_func_UInt32_void_ptr_UInt32 *)ppmd._48_8_ == p_Var20)) &&
                    (p_Var21 == (_func_UInt32_void_ptr_UInt32 *)0x0)) {
              local_4ce0 = 0;
            }
            else {
              if ((inProcessed != 0) || (uVar10 != ppmd._48_8_)) goto LAB_0059ca63;
LAB_0059cb2b:
              local_4ce0 = 1;
            }
          }
        }
        goto LAB_0059cb8d;
      }
      local_4c78 = local_4cc8;
      goto LAB_0059c14a;
    }
    if (UVar13 != 0) goto LAB_0059cca1;
    if (p_Var21 != p_Var20) {
      local_4ce0 = 1;
      goto LAB_0059cccc;
    }
    local_4ce0 = SzDecodeCopy((UInt64)p_Var20,pIVar9,(Byte *)local_4cb8);
joined_r0x0059c6ff:
    if (local_4ce0 != 0) goto LAB_0059cccc;
LAB_0059cc16:
    UVar13 = folder.NumCoders;
  }
  local_4ce0 = 0;
LAB_0059cccc:
  local_4c78 = local_4cc8;
LAB_0059c14a:
  for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
    (*allocMain->Free)(allocMain,*(void **)(local_4c88 + lVar22 * 8));
  }
  if (local_4ce0 == 0) {
    pBVar7 = (local_4c90->FolderCRCs).Defs;
    if (pBVar7 == (Byte *)0x0) {
      local_4ce0 = 0;
    }
    else {
      local_4ce0 = 0;
      if ((char)(pBVar7[folderIndex >> 3] << ((byte)folderIndex & 7)) < '\0') {
        UVar13 = CrcCalc(outBuffer,outSize);
        local_4ce0 = (uint)(UVar13 != (local_4c90->FolderCRCs).Vals[local_4bd8]) * 3;
      }
    }
  }
  return local_4ce0;
LAB_0059ca63:
  local_4ce0 = (*pIVar9->Skip)(pIVar9,inProcessed);
  if (local_4ce0 != 0) goto LAB_0059cb8d;
  goto LAB_0059c99e;
}

Assistant:

SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}